

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void PathBezierCubicCurveToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float x4,float y4,float tess_tol,int level)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float x3_00;
  float y3_00;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  ImVec2 *pIVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 in_register_00001284 [60];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 in_register_000012c4 [60];
  undefined1 auVar16 [64];
  undefined1 in_register_00001304 [60];
  undefined1 auVar17 [64];
  undefined1 in_register_00001344 [60];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  auVar18._4_60_ = in_register_00001344;
  auVar18._0_4_ = y3;
  auVar17._4_60_ = in_register_00001304;
  auVar17._0_4_ = x3;
  auVar16._4_60_ = in_register_000012c4;
  auVar16._0_4_ = y2;
  auVar14._4_60_ = in_register_00001284;
  auVar14._0_4_ = x2;
  auVar15 = auVar16._0_16_;
  auVar13 = auVar14._0_16_;
  while( true ) {
    fVar7 = x4 - x1;
    fVar8 = y4 - y1;
    auVar19 = vinsertps_avx(auVar13,auVar17._0_16_,0x10);
    auVar6._4_4_ = x4;
    auVar6._0_4_ = x4;
    auVar6._8_4_ = x4;
    auVar6._12_4_ = x4;
    auVar6 = vsubps_avx(auVar19,auVar6);
    auVar19 = vinsertps_avx(auVar15,auVar18._0_16_,0x10);
    auVar9._4_4_ = y4;
    auVar9._0_4_ = y4;
    auVar9._8_4_ = y4;
    auVar9._12_4_ = y4;
    auVar19 = vsubps_avx(auVar19,auVar9);
    auVar20._0_4_ = fVar7 * auVar19._0_4_;
    auVar20._4_4_ = fVar7 * auVar19._4_4_;
    auVar20._8_4_ = fVar7 * auVar19._8_4_;
    auVar20._12_4_ = fVar7 * auVar19._12_4_;
    auVar19._0_4_ = auVar6._0_4_ * fVar8;
    auVar19._4_4_ = auVar6._4_4_ * fVar8;
    auVar19._8_4_ = auVar6._8_4_ * fVar8;
    auVar19._12_4_ = auVar6._12_4_ * fVar8;
    auVar6 = vsubps_avx(auVar19,auVar20);
    auVar21._0_8_ = auVar6._0_8_ ^ 0x8000000080000000;
    auVar21._8_4_ = auVar6._8_4_ ^ 0x80000000;
    auVar21._12_4_ = auVar6._12_4_ ^ 0x80000000;
    auVar19 = vcmpps_avx(auVar21,auVar6,2);
    auVar19 = vblendvps_avx(auVar21,auVar6,auVar19);
    auVar19 = vhaddps_avx(auVar19,auVar19);
    if (auVar19._0_4_ * auVar19._0_4_ < tess_tol * (fVar7 * fVar7 + fVar8 * fVar8)) {
      iVar1 = path->Capacity;
      if (path->Size == iVar1) {
        iVar12 = path->Size + 1;
        if (iVar1 == 0) {
          iVar11 = 8;
        }
        else {
          iVar11 = iVar1 / 2 + iVar1;
        }
        if (iVar12 < iVar11) {
          iVar12 = iVar11;
        }
        if (iVar1 < iVar12) {
          pIVar10 = (ImVec2 *)ImGui::MemAlloc((long)iVar12 << 3);
          if (path->Data != (ImVec2 *)0x0) {
            memcpy(pIVar10,path->Data,(long)path->Size << 3);
            ImGui::MemFree(path->Data);
          }
          path->Data = pIVar10;
          path->Capacity = iVar12;
        }
      }
      pIVar10 = path->Data;
      iVar1 = path->Size;
      pIVar10[iVar1].x = x4;
      pIVar10[iVar1].y = y4;
      path->Size = path->Size + 1;
      return;
    }
    if (9 < level) break;
    fVar7 = (auVar13._0_4_ + x1) * 0.5;
    fVar8 = (auVar15._0_4_ + y1) * 0.5;
    fVar2 = (auVar13._0_4_ + auVar17._0_4_) * 0.5;
    fVar3 = (auVar15._0_4_ + auVar18._0_4_) * 0.5;
    fVar4 = (x4 + auVar17._0_4_) * 0.5;
    fVar5 = (y4 + auVar18._0_4_) * 0.5;
    x3_00 = (fVar7 + fVar2) * 0.5;
    y3_00 = (fVar8 + fVar3) * 0.5;
    fVar2 = (fVar4 + fVar2) * 0.5;
    auVar13 = ZEXT416((uint)fVar2);
    fVar3 = (fVar5 + fVar3) * 0.5;
    auVar15 = ZEXT416((uint)fVar3);
    fVar2 = (fVar2 + x3_00) * 0.5;
    fVar3 = (y3_00 + fVar3) * 0.5;
    level = level + 1;
    PathBezierCubicCurveToCasteljau(path,x1,y1,fVar7,fVar8,x3_00,y3_00,fVar2,fVar3,tess_tol,level);
    auVar17 = ZEXT464((uint)fVar4);
    auVar18 = ZEXT464((uint)fVar5);
    x1 = fVar2;
    y1 = fVar3;
  }
  return;
}

Assistant:

static void PathBezierCubicCurveToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = (x2 - x4) * dy - (y2 - y4) * dx;
    float d3 = (x3 - x4) * dy - (y3 - y4) * dx;
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2 + d3) * (d2 + d3) < tess_tol * (dx * dx + dy * dy))
    {
        path->push_back(ImVec2(x4, y4));
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2) * 0.5f, y12 = (y1 + y2) * 0.5f;
        float x23 = (x2 + x3) * 0.5f, y23 = (y2 + y3) * 0.5f;
        float x34 = (x3 + x4) * 0.5f, y34 = (y3 + y4) * 0.5f;
        float x123 = (x12 + x23) * 0.5f, y123 = (y12 + y23) * 0.5f;
        float x234 = (x23 + x34) * 0.5f, y234 = (y23 + y34) * 0.5f;
        float x1234 = (x123 + x234) * 0.5f, y1234 = (y123 + y234) * 0.5f;
        PathBezierCubicCurveToCasteljau(path, x1, y1, x12, y12, x123, y123, x1234, y1234, tess_tol, level + 1);
        PathBezierCubicCurveToCasteljau(path, x1234, y1234, x234, y234, x34, y34, x4, y4, tess_tol, level + 1);
    }
}